

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathNodeSetDel(void)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr val_00;
  xmlNodePtr val_01;
  int local_2c;
  int n_val;
  xmlNodePtr val;
  int n_cur;
  xmlNodeSetPtr cur;
  int mem_base;
  int test_ret;
  
  cur._4_4_ = 0;
  for (val._4_4_ = 0; (int)val._4_4_ < 1; val._4_4_ = val._4_4_ + 1) {
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val_00 = gen_xmlNodeSetPtr(val._4_4_,0);
      val_01 = gen_xmlNodePtr(local_2c,1);
      xmlXPathNodeSetDel(val_00,val_01);
      call_tests = call_tests + 1;
      des_xmlNodeSetPtr(val._4_4_,val_00,0);
      des_xmlNodePtr(local_2c,val_01,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetDel",(ulong)(uint)(iVar2 - iVar1));
        cur._4_4_ = cur._4_4_ + 1;
        printf(" %d",(ulong)val._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return cur._4_4_;
}

Assistant:

static int
test_xmlXPathNodeSetDel(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlNodeSetPtr cur; /* the initial node set */
    int n_cur;
    xmlNodePtr val; /* an xmlNodePtr */
    int n_val;

    for (n_cur = 0;n_cur < gen_nb_xmlNodeSetPtr;n_cur++) {
    for (n_val = 0;n_val < gen_nb_xmlNodePtr;n_val++) {
        mem_base = xmlMemBlocks();
        cur = gen_xmlNodeSetPtr(n_cur, 0);
        val = gen_xmlNodePtr(n_val, 1);

        xmlXPathNodeSetDel(cur, val);
        call_tests++;
        des_xmlNodeSetPtr(n_cur, cur, 0);
        des_xmlNodePtr(n_val, val, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathNodeSetDel",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_cur);
            printf(" %d", n_val);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}